

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O1

void __thiscall
PythonModuleClient::PythonModuleClient(PythonModuleClient *this,string *id,string *addr,int port)

{
  pointer pcVar1;
  string local_68;
  string local_48;
  
  pcVar1 = (id->_M_dataplus)._M_p;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_48,pcVar1,pcVar1 + id->_M_string_length);
  pcVar1 = (addr->_M_dataplus)._M_p;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_68,pcVar1,pcVar1 + addr->_M_string_length);
  AbstractModuleClient::AbstractModuleClient
            (&this->super_AbstractModuleClient,&local_48,&local_68,port);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
  }
  (this->super_wrapper<AbstractModuleClient>).super_wrapper_base.m_self = (PyObject *)0x0;
  (this->super_AbstractModuleClient).super_MlmWrap._vptr_MlmWrap =
       (_func_int **)&PTR__PythonModuleClient_003f01c0;
  return;
}

Assistant:

PythonModuleClient(std::string id, std::string addr, int port) : AbstractModuleClient(id, addr, port){
    }